

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::operator=(QByteArray *this,char *str)

{
  long in_FS_OFFSET;
  QByteArrayView local_48;
  QArrayDataPointer<char> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = str;
  if (str == (char *)0x0) {
    QArrayDataPointer<char>::clear(&this->d);
  }
  else if (*str == '\0') {
    local_38.d = (Data *)0x0;
    local_38.ptr = &_empty;
    local_38.size = 0;
    QArrayDataPointer<char>::operator=(&this->d,&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  else {
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&local_20);
    assign(this,local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::operator=(const char *str)
{
    if (!str) {
        d.clear();
    } else if (!*str) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        assign(str);
    }
    return *this;
}